

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O2

void pstore::log<pstore::logger::quoted>(priority p,czstring message,quoted d)

{
  undefined8 *puVar1;
  long *plVar2;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar3;
  
  plVar2 = (long *)details::log_destinations();
  if (*plVar2 != 0) {
    plVar2 = (long *)details::log_destinations();
    puVar1 = (undefined8 *)((undefined8 *)*plVar2)[1];
    for (puVar3 = *(undefined8 **)*plVar2; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      (**(code **)(*(long *)*puVar3 + 0x58))((long *)*puVar3,p,message,d.str_);
    }
  }
  return;
}

Assistant:

inline void log (logger::priority p, gsl::czstring message, T d) {
            if (details::log_destinations != nullptr) {
                for (std::unique_ptr<logger> & destination : *details::log_destinations) {
                    destination->log (p, message, d);
                }
            }
        }